

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::calcStatesStatesFixedScaling
          (BeagleCPUImpl<double,_1,_1> *this,double *destP,int *child1States,double *child1TransMat,
          int *child2States,double *child2TransMat,double *scaleFactors,int startPattern,
          int endPattern)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int pad;
  int i;
  double scaleFactor;
  int w;
  int state2;
  int state1;
  int k;
  int v;
  int l;
  double *child2TransMat_local;
  int *child2States_local;
  double *child1TransMat_local;
  int *child1States_local;
  double *destP_local;
  BeagleCPUImpl<double,_1,_1> *this_local;
  
  for (l = 0; l < this->kCategoryCount; l = l + 1) {
    v = l * this->kPartialsPaddedStateCount * this->kPatternCount +
        this->kPartialsPaddedStateCount * startPattern;
    for (k = startPattern; k < endPattern; k = k + 1) {
      iVar2 = child1States[k];
      iVar3 = child2States[k];
      w = l * this->kMatrixSize;
      dVar1 = scaleFactors[k];
      for (i = 0; i < this->kStateCount; i = i + 1) {
        destP[v] = (child1TransMat[w + iVar2] * child2TransMat[w + iVar3]) / dVar1;
        v = v + 1;
        w = this->kTransPaddedStateCount + w;
      }
      pad = 0;
      while( true ) {
        if (0 < pad) break;
        destP[v] = 0.0;
        v = v + 1;
        pad = pad + 1;
      }
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcStatesStatesFixedScaling(REALTYPE* destP,
                                                                     const int* child1States,
                                                                     const REALTYPE* child1TransMat,
                                                                     const int* child2States,
                                                                     const REALTYPE* child2TransMat,
                                                                     const REALTYPE* scaleFactors,
                                                                     int startPattern,
                                                                     int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
    int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        for (int k = startPattern; k < endPattern; k++) {
            const int state1 = child1States[k];
            const int state2 = child2States[k];
            int w = l * kMatrixSize;
            REALTYPE scaleFactor = scaleFactors[k];
            for (int i = 0; i < kStateCount; i++) {
                destP[v] = child1TransMat[w + state1] *
                           child2TransMat[w + state2] / scaleFactor;
                v++;

                w += kTransPaddedStateCount;
            }
            if (P_PAD) {
                for (int pad = 0; pad < P_PAD; pad++)  {
                    destP[v] = 0.0;
                    v++;
                }
            }
        }
    }
}